

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# potion.c
# Opt level: O1

void make_sick(long xtime,char *cause,boolean talk,int type)

{
  boolean bVar1;
  long lVar2;
  byte bVar3;
  uint uVar4;
  
  uVar4 = u.uprops[0x1d].intrinsic;
  if (xtime < 1) {
    if ((u.uprops[0x1d].intrinsic == 0) || (((byte)u._971_1_ & 3 & type) == 0)) goto LAB_0021a67b;
    bVar3 = ~(byte)type & (byte)((byte)u._971_1_ & 3);
    u._971_1_ = u._971_1_ & 0xfc | bVar3;
    if (bVar3 == 0) {
      if (talk == '\0') {
        u.uprops[0x1d].intrinsic = 0;
      }
      else {
        pline("What a relief!");
        u.uprops[0x1d].intrinsic = 0;
      }
    }
    else {
      if (talk != '\0') {
        pline("You feel somewhat better.");
      }
      uVar4 = 0xffffff;
      if (u.uprops[0x1d].intrinsic * 2 < 0xffffff) {
        uVar4 = u.uprops[0x1d].intrinsic * 2;
      }
      u.uprops[0x1d].intrinsic = uVar4 | u.uprops[0x1d].intrinsic & 0xff000000;
    }
  }
  else {
    if (u.uprops[0x34].intrinsic != 0) {
      return;
    }
    if (youmonst.data == mons + 0xfd || (youmonst.data)->mlet == ' ') {
      return;
    }
    bVar1 = defends(0x21,uwep);
    if (bVar1 != '\0') {
      return;
    }
    if (uVar4 == 0) {
      pline("You feel deathly sick.");
    }
    else if (talk != '\0') {
      pline("You feel %s worse.");
    }
    lVar2 = 0xffffff;
    if (xtime < 0xffffff) {
      lVar2 = xtime;
    }
    u._971_1_ = u._971_1_ | (byte)type & 3;
    u.uprops[0x1d].intrinsic = (uint)lVar2 | u.uprops[0x1d].intrinsic & 0xff000000;
  }
  iflags.botl = '\x01';
LAB_0021a67b:
  if ((u.uprops[0x1d].intrinsic == 0) || (exercise(4,'\0'), cause == (char *)0x0)) {
    u.usick_cause[0] = '\0';
  }
  else {
    strncpy(u.usick_cause,cause,0x53);
    u.usick_cause[0x52] = '\0';
  }
  return;
}

Assistant:

void make_sick(long xtime, const char *cause, boolean talk, int type)
{
	long old = Sick;

	if (xtime > 0L) {
	    if (Sick_resistance) return;
	    if (!old) {
		/* newly sick */
		pline("You feel deathly sick.");
	    } else {
		/* already sick */
		if (talk) pline("You feel %s worse.",
			      xtime <= Sick/2L ? "much" : "even");
	    }
	    set_itimeout(&Sick, xtime);
	    u.usick_type |= type;
	    iflags.botl = TRUE;
	} else if (old && (type & u.usick_type)) {
	    /* was sick, now not */
	    u.usick_type &= ~type;
	    if (u.usick_type) { /* only partly cured */
		if (talk) pline("You feel somewhat better.");
		set_itimeout(&Sick, Sick * 2); /* approximation */
	    } else {
		if (talk) pline("What a relief!");
		Sick = 0L;		/* set_itimeout(&Sick, 0L) */
	    }
	    iflags.botl = TRUE;
	}

	if (Sick) {
	    exercise(A_CON, FALSE);
	    if (cause) {
		strncpy(u.usick_cause, cause, sizeof(u.usick_cause));
		u.usick_cause[sizeof(u.usick_cause)-1] = 0;
		}
	    else
		u.usick_cause[0] = 0;
	} else
	    u.usick_cause[0] = 0;
}